

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# munkres.cpp
# Opt level: O0

bool trt_pose::parse::munkresStep3
               (float *cost_graph,int M,PairGraph *star_graph,PairGraph *prime_graph,
               CoverTable *cover_table,pair<int,_int> *p,int nrows,int ncols)

{
  bool bVar1;
  int col;
  int local_48;
  int local_44;
  int j;
  int i;
  pair<int,_int> *p_local;
  CoverTable *cover_table_local;
  PairGraph *prime_graph_local;
  PairGraph *star_graph_local;
  int M_local;
  float *cost_graph_local;
  
  local_44 = 0;
  do {
    if (nrows <= local_44) {
      return false;
    }
    for (local_48 = 0; local_48 < ncols; local_48 = local_48 + 1) {
      if (((cost_graph[local_44 * M + local_48] == 0.0) &&
          (!NAN(cost_graph[local_44 * M + local_48]))) &&
         (bVar1 = utils::CoverTable::isCovered(cover_table,local_44,local_48), !bVar1)) {
        utils::PairGraph::set(prime_graph,local_44,local_48);
        bVar1 = utils::PairGraph::isRowSet(star_graph,local_44);
        if (!bVar1) {
          p->first = local_44;
          p->second = local_48;
          return true;
        }
        utils::CoverTable::coverRow(cover_table,local_44);
        col = utils::PairGraph::colForRow(star_graph,local_44);
        utils::CoverTable::uncoverCol(cover_table,col);
      }
    }
    local_44 = local_44 + 1;
  } while( true );
}

Assistant:

bool munkresStep3(const float *cost_graph, const int M,
                  const PairGraph &star_graph, PairGraph &prime_graph,
                  CoverTable &cover_table, std::pair<int, int> &p,
                  const int nrows, const int ncols) {
  for (int i = 0; i < nrows; i++) {
    for (int j = 0; j < ncols; j++) {
      if (cost_graph[i * M + j] == 0 && !cover_table.isCovered(i, j)) {
        prime_graph.set(i, j);
        if (star_graph.isRowSet(i)) {
          cover_table.coverRow(i);
          cover_table.uncoverCol(star_graph.colForRow(i));
        } else {
          p.first = i;
          p.second = j;
          return 1;
        }
      }
    }
  }
  return 0;
}